

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::write<char,fmt::v8::appender>
                   (appender out,basic_string_view<char> s,basic_format_specs<char> *specs)

{
  basic_string_view<char> s_00;
  string_view s_01;
  type tVar1;
  char *s_02;
  appender aVar2;
  int *in_RCX;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  basic_format_specs<char> *in_stack_00000010;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_00000018;
  size_t width;
  size_t size;
  char *data;
  size_t in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  size_t local_38;
  basic_string_view<char> local_20;
  anon_class_16_2_3f014a30 *in_stack_fffffffffffffff8;
  
  s_02 = basic_string_view<char>::data(&local_20);
  local_38 = basic_string_view<char>::size(&local_20);
  if ((-1 < in_RCX[1]) && (tVar1 = to_unsigned<int>(0), tVar1 < local_38)) {
    to_unsigned<int>(0);
    s_00.size_ = in_stack_ffffffffffffff90;
    s_00.data_ = in_stack_ffffffffffffff88;
    local_38 = code_point_index<char>(s_00,in_stack_ffffffffffffff80);
  }
  if (*in_RCX != 0) {
    basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)&stack0xffffffffffffffa0,s_02,local_38);
    s_01.size_ = (size_t)in_stack_ffffffffffffffa0;
    s_01.data_ = in_stack_ffffffffffffff98;
    compute_width(s_01);
  }
  aVar2 = write_padded<(fmt::v8::align::type)1,fmt::v8::appender,char,fmt::v8::detail::write<char,fmt::v8::appender>(fmt::v8::appender,fmt::v8::basic_string_view<char>,fmt::v8::basic_format_specs<char>const&)::_lambda(fmt::v8::appender)_1_>
                    ((appender)in_stack_00000018.container,in_stack_00000010,in_stack_00000008,
                     unaff_retaddr,in_stack_fffffffffffffff8);
  return (appender)
         aVar2.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, basic_string_view<Char> s,
                         const basic_format_specs<Char>& specs) -> OutputIt {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  auto width =
      specs.width != 0 ? compute_width(basic_string_view<Char>(data, size)) : 0;
  return write_padded(out, specs, size, width,
                      [=](reserve_iterator<OutputIt> it) {
                        return copy_str<Char>(data, data + size, it);
                      });
}